

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3_str_reset(StrAccum *p)

{
  void *in_RDI;
  
  if ((*(byte *)((long)in_RDI + 0x1d) & 4) != 0) {
    sqlite3DbFree((sqlite3 *)p,in_RDI);
    *(byte *)((long)in_RDI + 0x1d) = *(byte *)((long)in_RDI + 0x1d) & 0xfb;
  }
  *(undefined4 *)((long)in_RDI + 0x10) = 0;
  *(undefined4 *)((long)in_RDI + 0x18) = 0;
  *(undefined8 *)((long)in_RDI + 8) = 0;
  return;
}

Assistant:

SQLITE_API void sqlite3_str_reset(StrAccum *p){
  if( isMalloced(p) ){
    sqlite3DbFree(p->db, p->zText);
    p->printfFlags &= ~SQLITE_PRINTF_MALLOCED;
  }
  p->nAlloc = 0;
  p->nChar = 0;
  p->zText = 0;
}